

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstat.cc
# Opt level: O0

bool anon_unknown.dwarf_25f2::OutputStatistics
               (StatisticsAccumulation *accumulation,Buffer *buffer,int vector_length,
               OutputFormats output_format,double confidence_level,
               bool outputs_only_diagonal_elements)

{
  bool bVar1;
  undefined1 uVar2;
  vector<double,_std::allocator<double>_> *lower_bound_00;
  int in_ECX;
  int in_EDX;
  Buffer *in_RSI;
  StatisticsAccumulation *in_RDI;
  byte in_R8B;
  vector<double,_std::allocator<double>_> tmp;
  SymmetricMatrix second;
  vector<double,_std::allocator<double>_> first;
  int num_data_1;
  vector<double,_std::allocator<double>_> upper_bound;
  vector<double,_std::allocator<double>_> lower_bound;
  vector<double,_std::allocator<double>_> variance_3;
  vector<double,_std::allocator<double>_> mean_1;
  int num_data;
  SymmetricMatrix precision_matrix;
  SymmetricMatrix variance_2;
  SymmetricMatrix correlation;
  vector<double,_std::allocator<double>_> standard_deviation;
  SymmetricMatrix variance_1;
  vector<double,_std::allocator<double>_> variance;
  vector<double,_std::allocator<double>_> mean;
  undefined5 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6d;
  undefined1 in_stack_fffffffffffffc6e;
  undefined1 in_stack_fffffffffffffc6f;
  Buffer *in_stack_fffffffffffffc70;
  StatisticsAccumulation *in_stack_fffffffffffffc78;
  undefined6 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc86;
  undefined1 in_stack_fffffffffffffc87;
  size_type in_stack_fffffffffffffc88;
  SymmetricMatrix *this;
  undefined4 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc94;
  undefined1 in_stack_fffffffffffffc95;
  undefined1 in_stack_fffffffffffffc96;
  undefined1 in_stack_fffffffffffffc97;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc98;
  Buffer *in_stack_fffffffffffffca0;
  StatisticsAccumulation *in_stack_fffffffffffffca8;
  SymmetricMatrix *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  Buffer *in_stack_fffffffffffffcc0;
  StatisticsAccumulation *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  vector<double,_std::allocator<double>_> *variance_00;
  undefined6 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcee;
  undefined1 in_stack_fffffffffffffcef;
  undefined8 in_stack_fffffffffffffcf0;
  int iVar3;
  undefined6 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcfe;
  undefined1 in_stack_fffffffffffffcff;
  undefined5 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0d;
  undefined1 in_stack_fffffffffffffd0e;
  undefined1 in_stack_fffffffffffffd0f;
  Buffer *in_stack_fffffffffffffd10;
  StatisticsAccumulation *in_stack_fffffffffffffd18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd28;
  undefined5 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd35;
  undefined1 in_stack_fffffffffffffd36;
  undefined1 in_stack_fffffffffffffd37;
  StatisticsAccumulation *in_stack_fffffffffffffd38;
  SymmetricMatrix *in_stack_fffffffffffffd78;
  Buffer *in_stack_fffffffffffffd80;
  StatisticsAccumulation *in_stack_fffffffffffffd88;
  SymmetricMatrix *in_stack_fffffffffffffd90;
  SymmetricMatrix *in_stack_fffffffffffffd98;
  undefined1 local_240 [63];
  SymmetricMatrix local_201;
  vector<double,_std::allocator<double>_> local_1c1;
  int local_1a4 [17];
  undefined1 local_160 [135];
  StatisticsAccumulation local_d9;
  vector<double,_std::allocator<double>_> local_c0 [4];
  int local_60;
  byte local_29;
  int local_20;
  int local_1c;
  Buffer *local_18;
  StatisticsAccumulation *local_10;
  byte local_1;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
  local_29 = in_R8B & 1;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (((in_ECX == 0) || (in_ECX == 1)) || (in_ECX == 6)) {
    std::allocator<double>::allocator((allocator<double> *)0x10673a);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffc97,
                        CONCAT16(in_stack_fffffffffffffc96,
                                 CONCAT15(in_stack_fffffffffffffc95,
                                          CONCAT14(in_stack_fffffffffffffc94,
                                                   in_stack_fffffffffffffc90)))),
               in_stack_fffffffffffffc88,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffffc87,
                        CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
    std::allocator<double>::~allocator((allocator<double> *)0x106766);
    bVar1 = sptk::StatisticsAccumulation::GetMean
                      (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                       (vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    if (bVar1) {
      bVar1 = sptk::WriteStream<double>
                        ((int)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                         (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb0,
                         (ostream *)in_stack_fffffffffffffca8,(int *)in_stack_fffffffffffffca0);
      if (bVar1) {
        local_60 = 0;
      }
      else {
        local_1 = 0;
        local_60 = 1;
      }
    }
    else {
      local_1 = 0;
      local_60 = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffc87,
                        CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
    if (local_60 != 0) goto LAB_001076a4;
  }
  if ((local_20 == 0) || (local_20 == 2)) {
    if ((local_29 & 1) == 0) {
      in_stack_fffffffffffffd28 = local_c0;
      sptk::SymmetricMatrix::SymmetricMatrix
                (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
      in_stack_fffffffffffffd35 =
           sptk::StatisticsAccumulation::GetFullCovariance
                     (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78)
      ;
      if ((bool)in_stack_fffffffffffffd35) {
        bVar1 = sptk::WriteStream((SymmetricMatrix *)
                                  CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                                  (ostream *)in_stack_fffffffffffffcb0);
        if (bVar1) {
          local_60 = 0;
        }
        else {
          local_1 = 0;
          local_60 = 1;
        }
      }
      else {
        local_1 = 0;
        local_60 = 1;
      }
      sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)in_stack_fffffffffffffc70);
    }
    else {
      in_stack_fffffffffffffd38 = (StatisticsAccumulation *)(long)local_1c;
      std::allocator<double>::allocator((allocator<double> *)0x1068c4);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffc97,
                          CONCAT16(in_stack_fffffffffffffc96,
                                   CONCAT15(in_stack_fffffffffffffc95,
                                            CONCAT14(in_stack_fffffffffffffc94,
                                                     in_stack_fffffffffffffc90)))),
                 in_stack_fffffffffffffc88,
                 (allocator_type *)
                 CONCAT17(in_stack_fffffffffffffc87,
                          CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
      std::allocator<double>::~allocator((allocator<double> *)0x1068f0);
      in_stack_fffffffffffffd37 =
           sptk::StatisticsAccumulation::GetDiagonalCovariance
                     (in_stack_fffffffffffffd38,
                      (Buffer *)
                      CONCAT17(in_stack_fffffffffffffd37,
                               CONCAT16(in_stack_fffffffffffffd36,
                                        CONCAT15(in_stack_fffffffffffffd35,in_stack_fffffffffffffd30
                                                ))),in_stack_fffffffffffffd28);
      if ((bool)in_stack_fffffffffffffd37) {
        in_stack_fffffffffffffd36 =
             sptk::WriteStream<double>
                       ((int)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                        (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb0,
                        (ostream *)in_stack_fffffffffffffca8,(int *)in_stack_fffffffffffffca0);
        if ((bool)in_stack_fffffffffffffd36) {
          local_60 = 0;
        }
        else {
          local_1 = 0;
          local_60 = 1;
        }
      }
      else {
        local_1 = 0;
        local_60 = 1;
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffc87,
                          CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
    }
    if (local_60 != 0) goto LAB_001076a4;
  }
  if (local_20 == 3) {
    in_stack_fffffffffffffd10 = (Buffer *)(long)local_1c;
    in_stack_fffffffffffffd18 = &local_d9;
    std::allocator<double>::allocator((allocator<double> *)0x106b2f);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffc97,
                        CONCAT16(in_stack_fffffffffffffc96,
                                 CONCAT15(in_stack_fffffffffffffc95,
                                          CONCAT14(in_stack_fffffffffffffc94,
                                                   in_stack_fffffffffffffc90)))),
               in_stack_fffffffffffffc88,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffffc87,
                        CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
    std::allocator<double>::~allocator((allocator<double> *)0x106b5b);
    in_stack_fffffffffffffd0f =
         sptk::StatisticsAccumulation::GetStandardDeviation
                   (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    if ((bool)in_stack_fffffffffffffd0f) {
      in_stack_fffffffffffffd0e =
           sptk::WriteStream<double>
                     ((int)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                      (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb0,
                      (ostream *)in_stack_fffffffffffffca8,(int *)in_stack_fffffffffffffca0);
      if ((bool)in_stack_fffffffffffffd0e) {
        local_60 = 0;
      }
      else {
        local_1 = 0;
        local_60 = 1;
      }
    }
    else {
      local_1 = 0;
      local_60 = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffc87,
                        CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
    if (local_60 != 0) goto LAB_001076a4;
  }
  if (local_20 == 4) {
    sptk::SymmetricMatrix::SymmetricMatrix
              (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    bVar1 = sptk::StatisticsAccumulation::GetCorrelation
                      (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                       (SymmetricMatrix *)
                       CONCAT17(in_stack_fffffffffffffd0f,
                                CONCAT16(in_stack_fffffffffffffd0e,
                                         CONCAT15(in_stack_fffffffffffffd0d,
                                                  in_stack_fffffffffffffd08))));
    if (bVar1) {
      in_stack_fffffffffffffcff =
           sptk::WriteStream((SymmetricMatrix *)
                             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                             (ostream *)in_stack_fffffffffffffcb0);
      if ((bool)in_stack_fffffffffffffcff) {
        local_60 = 0;
      }
      else {
        local_1 = 0;
        local_60 = 1;
      }
    }
    else {
      local_1 = 0;
      local_60 = 1;
    }
    sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)in_stack_fffffffffffffc70);
    if (local_60 != 0) goto LAB_001076a4;
  }
  if (local_20 == 5) {
    iVar3 = (int)((ulong)local_160 >> 0x20);
    sptk::SymmetricMatrix::SymmetricMatrix
              (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    in_stack_fffffffffffffcfe =
         sptk::StatisticsAccumulation::GetFullCovariance
                   (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    if ((bool)in_stack_fffffffffffffcfe) {
      sptk::SymmetricMatrix::SymmetricMatrix
                (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
      in_stack_fffffffffffffcef =
           sptk::SymmetricMatrix::Invert(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      if ((bool)in_stack_fffffffffffffcef) {
        in_stack_fffffffffffffcee =
             sptk::WriteStream((SymmetricMatrix *)
                               CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                               (ostream *)in_stack_fffffffffffffcb0);
        if ((bool)in_stack_fffffffffffffcee) {
          local_60 = 0;
        }
        else {
          local_1 = 0;
          local_60 = 1;
        }
      }
      else {
        local_1 = 0;
        local_60 = 1;
      }
      sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)in_stack_fffffffffffffc70);
    }
    else {
      local_1 = 0;
      local_60 = 1;
    }
    sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)in_stack_fffffffffffffc70);
    if (local_60 != 0) goto LAB_001076a4;
  }
  if (local_20 == 6) {
    bVar1 = sptk::StatisticsAccumulation::GetNumData(local_10,local_18,local_1a4);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_001076a4;
    }
    lower_bound_00 = (vector<double,_std::allocator<double>_> *)(long)local_1c;
    variance_00 = &local_1c1;
    std::allocator<double>::allocator((allocator<double> *)0x106f64);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffc97,
                        CONCAT16(in_stack_fffffffffffffc96,
                                 CONCAT15(in_stack_fffffffffffffc95,
                                          CONCAT14(in_stack_fffffffffffffc94,
                                                   in_stack_fffffffffffffc90)))),
               in_stack_fffffffffffffc88,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffffc87,
                        CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
    std::allocator<double>::~allocator((allocator<double> *)0x106f8a);
    uVar2 = sptk::StatisticsAccumulation::GetMean
                      (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                       (vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    if ((bool)uVar2) {
      in_stack_fffffffffffffcc0 = (Buffer *)(long)local_1c;
      std::allocator<double>::allocator((allocator<double> *)0x10702d);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffc97,
                          CONCAT16(in_stack_fffffffffffffc96,
                                   CONCAT15(in_stack_fffffffffffffc95,
                                            CONCAT14(in_stack_fffffffffffffc94,
                                                     in_stack_fffffffffffffc90)))),
                 in_stack_fffffffffffffc88,
                 (allocator_type *)
                 CONCAT17(in_stack_fffffffffffffc87,
                          CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
      std::allocator<double>::~allocator((allocator<double> *)0x107053);
      bVar1 = sptk::StatisticsAccumulation::GetDiagonalCovariance
                        (in_stack_fffffffffffffd38,
                         (Buffer *)
                         CONCAT17(in_stack_fffffffffffffd37,
                                  CONCAT16(in_stack_fffffffffffffd36,
                                           CONCAT15(in_stack_fffffffffffffd35,
                                                    in_stack_fffffffffffffd30))),
                         in_stack_fffffffffffffd28);
      in_stack_fffffffffffffcbc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcbc);
      if (bVar1) {
        in_stack_fffffffffffffca8 = (StatisticsAccumulation *)(long)local_1c;
        in_stack_fffffffffffffcb0 = &local_201;
        std::allocator<double>::allocator((allocator<double> *)0x1070f6);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffffc97,
                            CONCAT16(in_stack_fffffffffffffc96,
                                     CONCAT15(in_stack_fffffffffffffc95,
                                              CONCAT14(in_stack_fffffffffffffc94,
                                                       in_stack_fffffffffffffc90)))),
                   in_stack_fffffffffffffc88,
                   (allocator_type *)
                   CONCAT17(in_stack_fffffffffffffc87,
                            CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
        std::allocator<double>::~allocator((allocator<double> *)0x10711c);
        in_stack_fffffffffffffca0 = (Buffer *)(local_240 + 0x1f);
        std::allocator<double>::allocator((allocator<double> *)0x10713b);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffffc97,
                            CONCAT16(in_stack_fffffffffffffc96,
                                     CONCAT15(in_stack_fffffffffffffc95,
                                              CONCAT14(in_stack_fffffffffffffc94,
                                                       in_stack_fffffffffffffc90)))),
                   in_stack_fffffffffffffc88,
                   (allocator_type *)
                   CONCAT17(in_stack_fffffffffffffc87,
                            CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
        std::allocator<double>::~allocator((allocator<double> *)0x107161);
        in_stack_fffffffffffffc97 =
             sptk::ComputeLowerAndUpperBounds
                       ((double)CONCAT17(in_stack_fffffffffffffcff,
                                         CONCAT16(in_stack_fffffffffffffcfe,
                                                  in_stack_fffffffffffffcf8)),iVar3,
                        (vector<double,_std::allocator<double>_> *)
                        CONCAT17(in_stack_fffffffffffffcef,
                                 CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)),
                        variance_00,lower_bound_00,
                        (vector<double,_std::allocator<double>_> *)
                        CONCAT17(uVar2,in_stack_fffffffffffffcd0));
        if ((bool)in_stack_fffffffffffffc97) {
          in_stack_fffffffffffffc96 =
               sptk::WriteStream<double>
                         ((int)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                          (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb0,
                          (ostream *)in_stack_fffffffffffffca8,(int *)in_stack_fffffffffffffca0);
          if ((bool)in_stack_fffffffffffffc96) {
            in_stack_fffffffffffffc95 =
                 sptk::WriteStream<double>
                           ((int)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                            (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb0,
                            (ostream *)in_stack_fffffffffffffca8,(int *)in_stack_fffffffffffffca0);
            if ((bool)in_stack_fffffffffffffc95) {
              local_60 = 0;
            }
            else {
              local_1 = 0;
              local_60 = 1;
            }
          }
          else {
            local_1 = 0;
            local_60 = 1;
          }
        }
        else {
          local_1 = 0;
          local_60 = 1;
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffffc87,
                            CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffffc87,
                            CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
      }
      else {
        local_1 = 0;
        local_60 = 1;
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffc87,
                          CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
    }
    else {
      local_1 = 0;
      local_60 = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffc87,
                        CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
    if (local_60 != 0) goto LAB_001076a4;
  }
  iVar3 = (int)in_stack_fffffffffffffcc0;
  if (local_20 == 7) {
    bVar1 = sptk::StatisticsAccumulation::GetNumData(local_10,local_18,(int *)(local_240 + 0x18));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_001076a4;
    }
    bVar1 = sptk::WriteStream<double>
                      ((double)CONCAT17(in_stack_fffffffffffffc6f,
                                        CONCAT16(in_stack_fffffffffffffc6e,
                                                 CONCAT15(in_stack_fffffffffffffc6d,
                                                          in_stack_fffffffffffffc68))),
                       (ostream *)0x107392);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_001076a4;
    }
    this = (SymmetricMatrix *)local_240;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x1073b5);
    uVar2 = sptk::StatisticsAccumulation::GetFirst
                      (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                       (vector<double,_std::allocator<double>_> *)
                       CONCAT17(in_stack_fffffffffffffc6f,
                                CONCAT16(in_stack_fffffffffffffc6e,
                                         CONCAT15(in_stack_fffffffffffffc6d,
                                                  in_stack_fffffffffffffc68))));
    if ((bool)uVar2) {
      in_stack_fffffffffffffc87 =
           sptk::WriteStream<double>
                     (iVar3,in_stack_fffffffffffffcbc,
                      (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb0,
                      (ostream *)in_stack_fffffffffffffca8,(int *)in_stack_fffffffffffffca0);
      if ((bool)in_stack_fffffffffffffc87) {
        sptk::SymmetricMatrix::SymmetricMatrix
                  (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
        in_stack_fffffffffffffc86 =
             sptk::StatisticsAccumulation::GetSecond
                       (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                        (SymmetricMatrix *)
                        CONCAT17(in_stack_fffffffffffffc6f,
                                 CONCAT16(in_stack_fffffffffffffc6e,
                                          CONCAT15(in_stack_fffffffffffffc6d,
                                                   in_stack_fffffffffffffc68))));
        if ((bool)in_stack_fffffffffffffc86) {
          if ((local_29 & 1) == 0) {
            bVar1 = sptk::WriteStream((SymmetricMatrix *)
                                      CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                                      (ostream *)in_stack_fffffffffffffcb0);
            if (bVar1) goto LAB_0010764a;
            local_1 = 0;
            local_60 = 1;
          }
          else {
            in_stack_fffffffffffffc70 = (Buffer *)(long)local_1c;
            std::allocator<double>::allocator((allocator<double> *)0x1074f4);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT17(in_stack_fffffffffffffc97,
                                CONCAT16(in_stack_fffffffffffffc96,
                                         CONCAT15(in_stack_fffffffffffffc95,
                                                  CONCAT14(uVar2,in_stack_fffffffffffffc90)))),
                       (size_type)this,
                       (allocator_type *)
                       CONCAT17(in_stack_fffffffffffffc87,
                                CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
            std::allocator<double>::~allocator((allocator<double> *)0x10751a);
            bVar1 = sptk::SymmetricMatrix::GetDiagonal
                              (this,(vector<double,_std::allocator<double>_> *)
                                    CONCAT17(in_stack_fffffffffffffc87,
                                             CONCAT16(in_stack_fffffffffffffc86,
                                                      in_stack_fffffffffffffc80)));
            if (bVar1) {
              bVar1 = sptk::WriteStream<double>
                                (iVar3,in_stack_fffffffffffffcbc,
                                 (vector<double,_std::allocator<double>_> *)
                                 in_stack_fffffffffffffcb0,(ostream *)in_stack_fffffffffffffca8,
                                 (int *)in_stack_fffffffffffffca0);
              if (bVar1) {
                local_60 = 0;
              }
              else {
                local_1 = 0;
                local_60 = 1;
              }
            }
            else {
              local_1 = 0;
              local_60 = 1;
            }
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT17(in_stack_fffffffffffffc87,
                                CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
            if (local_60 == 0) {
LAB_0010764a:
              local_60 = 0;
            }
          }
        }
        else {
          local_1 = 0;
          local_60 = 1;
        }
        sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)in_stack_fffffffffffffc70);
      }
      else {
        local_1 = 0;
        local_60 = 1;
      }
    }
    else {
      local_1 = 0;
      local_60 = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffc87,
                        CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
    if (local_60 != 0) goto LAB_001076a4;
  }
  local_1 = 1;
LAB_001076a4:
  return (bool)(local_1 & 1);
}

Assistant:

bool OutputStatistics(const sptk::StatisticsAccumulation& accumulation,
                      const sptk::StatisticsAccumulation::Buffer& buffer,
                      int vector_length, OutputFormats output_format,
                      double confidence_level,
                      bool outputs_only_diagonal_elements) {
  if (kMeanAndCovariance == output_format || kMean == output_format ||
      kMeanAndLowerAndUpperBounds == output_format) {
    std::vector<double> mean(vector_length);
    if (!accumulation.GetMean(buffer, &mean)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, mean, &std::cout, NULL)) {
      return false;
    }
  }

  if (kMeanAndCovariance == output_format || kCovariance == output_format) {
    if (outputs_only_diagonal_elements) {
      std::vector<double> variance(vector_length);
      if (!accumulation.GetDiagonalCovariance(buffer, &variance)) {
        return false;
      }
      if (!sptk::WriteStream(0, vector_length, variance, &std::cout, NULL)) {
        return false;
      }
    } else {
      sptk::SymmetricMatrix variance(vector_length);
      if (!accumulation.GetFullCovariance(buffer, &variance)) {
        return false;
      }
      if (!sptk::WriteStream(variance, &std::cout)) {
        return false;
      }
    }
  }

  if (kStandardDeviation == output_format) {
    std::vector<double> standard_deviation(vector_length);
    if (!accumulation.GetStandardDeviation(buffer, &standard_deviation)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, standard_deviation, &std::cout,
                           NULL)) {
      return false;
    }
  }

  if (kCorrelation == output_format) {
    sptk::SymmetricMatrix correlation(vector_length);
    if (!accumulation.GetCorrelation(buffer, &correlation)) {
      return false;
    }
    if (!sptk::WriteStream(correlation, &std::cout)) {
      return false;
    }
  }

  if (kPrecision == output_format) {
    sptk::SymmetricMatrix variance(vector_length);
    if (!accumulation.GetFullCovariance(buffer, &variance)) {
      return false;
    }

    sptk::SymmetricMatrix precision_matrix(vector_length);
    if (!variance.Invert(&precision_matrix)) {
      return false;
    }

    if (!sptk::WriteStream(precision_matrix, &std::cout)) {
      return false;
    }
  }

  if (kMeanAndLowerAndUpperBounds == output_format) {
    int num_data;
    if (!accumulation.GetNumData(buffer, &num_data)) {
      return false;
    }
    std::vector<double> mean(vector_length);
    if (!accumulation.GetMean(buffer, &mean)) {
      return false;
    }
    std::vector<double> variance(vector_length);
    if (!accumulation.GetDiagonalCovariance(buffer, &variance)) {
      return false;
    }

    std::vector<double> lower_bound(vector_length);
    std::vector<double> upper_bound(vector_length);
    if (!sptk::ComputeLowerAndUpperBounds(confidence_level, num_data, mean,
                                          variance, &lower_bound,
                                          &upper_bound)) {
      return false;
    }

    if (!sptk::WriteStream(0, vector_length, lower_bound, &std::cout, NULL)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, upper_bound, &std::cout, NULL)) {
      return false;
    }
  }

  if (kSufficientStatistics == output_format) {
    int num_data;
    if (!accumulation.GetNumData(buffer, &num_data)) {
      return false;
    }
    if (!sptk::WriteStream(static_cast<double>(num_data), &std::cout)) {
      return false;
    }

    std::vector<double> first;
    if (!accumulation.GetFirst(buffer, &first)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, first, &std::cout, NULL)) {
      return false;
    }

    sptk::SymmetricMatrix second;
    if (!accumulation.GetSecond(buffer, &second)) {
      return false;
    }
    if (outputs_only_diagonal_elements) {
      std::vector<double> tmp(vector_length);
      if (!second.GetDiagonal(&tmp)) {
        return false;
      }
      if (!sptk::WriteStream(0, vector_length, tmp, &std::cout, NULL)) {
        return false;
      }
    } else {
      if (!sptk::WriteStream(second, &std::cout)) {
        return false;
      }
    }
  }

  return true;
}